

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::StartAny
          (AnyWriter *this,DataPiece *value)

{
  TypeInfo *pTVar1;
  ProtoStreamObjectWriter *pPVar2;
  Type *type;
  pointer pEVar3;
  undefined4 uVar4;
  bool bVar5;
  Type **ppTVar6;
  TypeRenderer *pp_Var7;
  ProtoStreamObjectWriter *this_00;
  int i;
  ulong uVar8;
  long lVar9;
  StringPiece SVar10;
  StringPiece local_c0;
  StringPiece local_b0;
  undefined1 local_a0 [8];
  StatusOr<const_google::protobuf::Type_*> resolved_type;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  
  if (value->type_ == TYPE_STRING) {
    local_c0 = DataPiece::str(value);
    StringPiece::ToString_abi_cxx11_((string *)local_a0,&local_c0);
    std::__cxx11::string::operator=((string *)&this->type_url_,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    DataPiece::ToString_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,value);
    uVar4 = local_a0._0_4_;
    if (local_a0._0_4_ == OK) {
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_a0);
      std::__cxx11::string::_M_assign((string *)&this->type_url_);
    }
    else {
      pPVar2 = this->parent_;
      StringPiece::StringPiece(&local_58,"String");
      SVar10 = Status::message((Status *)local_a0);
      ProtoWriter::InvalidValue(&pPVar2->super_ProtoWriter,local_58,SVar10);
      this->invalid_ = true;
    }
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_a0);
    if (uVar4 != OK) {
      return;
    }
  }
  pTVar1 = (this->parent_->super_ProtoWriter).typeinfo_;
  StringPiece::StringPiece<std::allocator<char>>(&local_b0,&this->type_url_);
  (*pTVar1->_vptr_TypeInfo[2])(local_a0,pTVar1,local_b0.ptr_,local_b0.length_);
  if (local_a0._0_4_ == OK) {
    ppTVar6 = StatusOr<const_google::protobuf::Type_*>::value
                        ((StatusOr<const_google::protobuf::Type_*> *)local_a0);
    type = *ppTVar6;
    pp_Var7 = FindTypeRenderer(&this->type_url_);
    this->well_known_type_render_ = pp_Var7;
    if (((pp_Var7 != (TypeRenderer *)0x0) ||
        (bVar5 = std::operator==((type->name_).ptr_,"google.protobuf.Any"), bVar5)) ||
       (bVar5 = std::operator==((type->name_).ptr_,"google.protobuf.Struct"), bVar5)) {
      this->is_well_known_type_ = true;
    }
    this_00 = (ProtoStreamObjectWriter *)operator_new(0xf0);
    pPVar2 = this->parent_;
    ProtoStreamObjectWriter
              (this_00,(pPVar2->super_ProtoWriter).typeinfo_,type,&(this->output_).super_ByteSink,
               (pPVar2->super_ProtoWriter).listener_,&pPVar2->options_);
    pPVar2 = (this->ow_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
             ._M_head_impl;
    (this->ow_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
    .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
    _M_head_impl = this_00;
    if (pPVar2 != (ProtoStreamObjectWriter *)0x0) {
      (**(code **)(*(long *)&(pPVar2->super_ProtoWriter).super_StructuredObjectWriter + 8))();
    }
    if (this->is_well_known_type_ == false) {
      pPVar2 = (this->ow_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
               ._M_head_impl;
      StringPiece::StringPiece(&local_38,"");
      (**(code **)(*(long *)&(pPVar2->super_ProtoWriter).super_StructuredObjectWriter + 0x10))
                (pPVar2,local_38.ptr_,local_38.length_);
    }
    lVar9 = 0;
    for (uVar8 = 0;
        pEVar3 = (this->uninterpreted_events_).
                 super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)(((long)(this->uninterpreted_events_).
                               super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) / 0x70);
        uVar8 = uVar8 + 1) {
      Event::Replay((Event *)((long)&pEVar3->type_ + lVar9),this);
      lVar9 = lVar9 + 0x70;
    }
  }
  else {
    pPVar2 = this->parent_;
    StringPiece::StringPiece(&local_48,"Any");
    SVar10 = Status::message((Status *)local_a0);
    ProtoWriter::InvalidValue(&pPVar2->super_ProtoWriter,local_48,SVar10);
    this->invalid_ = true;
  }
  std::__cxx11::string::~string((string *)&resolved_type);
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::StartAny(const DataPiece& value) {
  // Figure out the type url. This is a copy-paste from WriteString but we also
  // need the value, so we can't just call through to that.
  if (value.type() == DataPiece::TYPE_STRING) {
    type_url_ = std::string(value.str());
  } else {
    StatusOr<std::string> s = value.ToString();
    if (!s.ok()) {
      parent_->InvalidValue("String", s.status().message());
      invalid_ = true;
      return;
    }
    type_url_ = s.value();
  }
  // Resolve the type url, and report an error if we failed to resolve it.
  StatusOr<const google::protobuf::Type*> resolved_type =
      parent_->typeinfo()->ResolveTypeUrl(type_url_);
  if (!resolved_type.ok()) {
    parent_->InvalidValue("Any", resolved_type.status().message());
    invalid_ = true;
    return;
  }
  // At this point, type is never null.
  const google::protobuf::Type* type = resolved_type.value();

  well_known_type_render_ = FindTypeRenderer(type_url_);
  if (well_known_type_render_ != nullptr ||
      // Explicitly list Any and Struct here because they don't have a
      // custom renderer.
      type->name() == kAnyType || type->name() == kStructType) {
    is_well_known_type_ = true;
  }

  // Create our object writer and initialize it with the first StartObject
  // call.
  ow_.reset(new ProtoStreamObjectWriter(parent_->typeinfo(), *type, &output_,
                                        parent_->listener(),
                                        parent_->options_));

  // Don't call StartObject() for well-known types yet. Depending on the
  // type of actual data, we may not need to call StartObject(). For
  // example:
  // {
  //   "@type": "type.googleapis.com/google.protobuf.Value",
  //   "value": [1, 2, 3],
  // }
  // With the above JSON representation, we will only call StartList() on the
  // contained ow_.
  if (!is_well_known_type_) {
    ow_->StartObject("");
  }

  // Now we know the proto type and can interpret all data fields we gathered
  // before the "@type" field.
  for (int i = 0; i < uninterpreted_events_.size(); ++i) {
    uninterpreted_events_[i].Replay(this);
  }
}